

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Binasc.cpp
# Opt level: O2

string * __thiscall
smf::Binasc::keyToPitchName_abi_cxx11_(string *__return_storage_ptr__,Binasc *this,int key)

{
  ulong uVar1;
  ulong uVar2;
  allocator local_1c1;
  char *local_1c0 [4];
  stringstream output;
  ostream local_190 [376];
  
  uVar1 = (ulong)(uint)((int)this >> 0x1f) << 0x20 | (ulong)this & 0xffffffff;
  uVar2 = (long)uVar1 % 0xc;
  std::__cxx11::stringstream::stringstream((stringstream *)&output);
  if ((uint)uVar2 < 0xc) {
    std::operator<<(local_190,&DAT_00120c48 + *(int *)(&DAT_00120c48 + (uVar2 & 0xffffffff) * 4));
  }
  std::ostream::operator<<(local_190,(int)((long)uVar1 / 0xc) + -1);
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::string((string *)__return_storage_ptr__,local_1c0[0],&local_1c1);
  std::__cxx11::string::~string((string *)local_1c0);
  std::__cxx11::stringstream::~stringstream((stringstream *)&output);
  return __return_storage_ptr__;
}

Assistant:

std::string Binasc::keyToPitchName(int key) {
	int pc = key % 12;
	int octave = key / 12 - 1;
	std::stringstream output;
	switch (pc) {
		case  0: output << "C";  break;
		case  1: output << "C#"; break;
		case  2: output << "D";  break;
		case  3: output << "D#"; break;
		case  4: output << "E";  break;
		case  5: output << "F";  break;
		case  6: output << "F#"; break;
		case  7: output << "G";  break;
		case  8: output << "G#"; break;
		case  9: output << "A";  break;
		case 10: output << "A#"; break;
		case 11: output << "B";  break;
	}
	output << octave;
	return output.str().c_str();
}